

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::shader_image_atomic
               (NegativeTestContext *ctx)

{
  ostream *poVar1;
  long lVar2;
  allocator<char> local_1c9;
  string local_1c8;
  ostringstream source;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&source,
             "GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders."
             ,&local_1c9);
  NegativeTestContext::beginSection(ctx,(string *)&source);
  std::__cxx11::string::~string((string *)&source);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 4) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&source);
    poVar1 = std::operator<<((ostream *)&source,
                             "#version 310 es\nlayout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\nprecision mediump float;\nvoid main()\n{\n\t"
                            );
    poVar1 = std::operator<<(poVar1,(char *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_119shader_image_atomicERNS2_19NegativeTestContextEE7s_tests_rel
                                            + (long)*(int *)((long)&
                                                  _ZZN4deqp6gles3110Functional18NegativeTestShared12_GLOBAL__N_119shader_image_atomicERNS2_19NegativeTestContextEE7s_tests_rel
                                                  + lVar2)));
    std::operator<<(poVar1,"\n}\n");
    std::__cxx11::stringbuf::str();
    verifyShader(ctx,SHADERTYPE_FRAGMENT,&local_1c8,EXPECT_RESULT_FAIL);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&source);
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void shader_image_atomic (NegativeTestContext& ctx)
{
	static const char* const s_tests[] =
	{
		"imageAtomicAdd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMin(u_image, ivec2(1, 1), 1u);",
		"imageAtomicMax(u_image, ivec2(1, 1), 1u);",
		"imageAtomicAnd(u_image, ivec2(1, 1), 1u);",
		"imageAtomicOr(u_image, ivec2(1, 1), 1u);",
		"imageAtomicXor(u_image, ivec2(1, 1), 1u);",
		"imageAtomicExchange(u_image, ivec2(1, 1), 1u);",
		"imageAtomicCompSwap(u_image, ivec2(1, 1), 1u, 1u);",
	};

	ctx.beginSection("GL_OES_shader_image_atomic features require enabling the extension in 310 es shaders.");
	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_tests); ++ndx)
	{
		std::ostringstream source;
		source <<	"#version 310 es\n"
					"layout(binding=0, r32ui) coherent uniform highp uimage2D u_image;\n"
					"precision mediump float;\n"
					"void main()\n"
					"{\n"
					"	" << s_tests[ndx] << "\n"
					"}\n";
		verifyShader(ctx, glu::SHADERTYPE_FRAGMENT, source.str(), EXPECT_RESULT_FAIL);
	}
	ctx.endSection();
}